

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

ElementTypeAndOffset * __thiscall
choc::value::Type::Object::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,Object *this,uint32_t index)

{
  MemberNameAndType *pMVar1;
  size_t sVar2;
  uint local_2c;
  size_t sStack_28;
  uint32_t i;
  size_t offset;
  uint32_t index_local;
  Object *this_local;
  
  sStack_28 = 0;
  local_2c = 0;
  while( true ) {
    if ((this->members).size <= local_2c) {
      throwError("Index out of range");
    }
    if (local_2c == index) break;
    pMVar1 = AllocatedVector<choc::value::MemberNameAndType>::operator[](&this->members,local_2c);
    sVar2 = Type::getValueDataSize(&pMVar1->type);
    sStack_28 = sVar2 + sStack_28;
    local_2c = local_2c + 1;
  }
  pMVar1 = AllocatedVector<choc::value::MemberNameAndType>::operator[](&this->members,local_2c);
  Type(&__return_storage_ptr__->elementType,&pMVar1->type);
  __return_storage_ptr__->offset = sStack_28;
  return __return_storage_ptr__;
}

Assistant:

ElementTypeAndOffset getElementInfo (uint32_t index) const
    {
        size_t offset = 0;

        for (uint32_t i = 0; i < members.size; ++i)
        {
            if (i == index)
                return { members[i].type, offset };

            offset += members[i].type.getValueDataSize();
        }

        throwError ("Index out of range");
    }